

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

void __thiscall
QJsonObject::QJsonObject(QJsonObject *this,initializer_list<std::pair<QString,_QJsonValue>_> args)

{
  QJsonValue *value;
  long lVar1;
  
  (this->o).d.ptr = (QCborContainerPrivate *)0x0;
  if (args._M_len != 0) {
    value = &(args._M_array)->second;
    lVar1 = args._M_len * 0x30;
    do {
      insertImpl<QStringView>
                (this,*(QStringView *)
                       &((QCborValue *)&((pair<QString,_QJsonValue> *)(value + -1))->first)->
                        container,value);
      value = value + 2;
      lVar1 = lVar1 + -0x30;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

explicit constexpr totally_ordered_wrapper(P p) noexcept : ptr(p) {}